

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O0

void rtrim(char *str)

{
  bool bVar1;
  size_t local_18;
  long length;
  char *str_local;
  
  local_18 = strlen(str);
  while( true ) {
    bVar1 = false;
    if (0 < (long)local_18) {
      bVar1 = str[local_18 - 1] == ' ';
    }
    if (!bVar1) break;
    str[local_18 - 1] = '\0';
    local_18 = local_18 - 1;
  }
  return;
}

Assistant:

static void rtrim(char *str)
{
    long length;

    length = (long)strlen(str);
    while (length > 0 && str[length - 1] == ' ')
    {
        str[length - 1] = '\0';
        length--;
    }
}